

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O3

void Gia_ManHighlight_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  
  if (iObj < p->nTravIdsAlloc) {
    do {
      if (p->pTravIds[iObj] == p->nTravIds) {
        return;
      }
      p->pTravIds[iObj] = p->nTravIds;
      if ((iObj < 0) || (p->nObjs <= iObj)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      uVar2 = *(ulong *)(pGVar1 + iObj);
      uVar3 = (uint)(uVar2 & 0x1fffffff);
      if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar2) {
        Gia_ManHighlight_rec(p,iObj - ((uint)uVar2 & 0x1fffffff));
        uVar2 = *(ulong *)(pGVar1 + iObj);
        uVar3 = (uint)uVar2 & 0x1fffffff;
      }
      if ((int)uVar2 < 0) {
        return;
      }
      if (uVar3 == 0x1fffffff) {
        return;
      }
      iObj = iObj - ((uint)(uVar2 >> 0x20) & 0x1fffffff);
    } while (iObj < p->nTravIdsAlloc);
  }
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManHighlight_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId1(pObj, iObj) );
}